

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O0

void __thiscall
boost::fusion::vector<unsigned_short&>::vector<unsigned_short&>
          (vector<unsigned_short&> *this,unsigned_short *u)

{
  unsigned_short *u_local;
  vector<unsigned_short_&> *this_local;
  
  vector_detail::dispatch<boost::fusion::vector<unsigned_short&>,unsigned_short>(u);
  vector_detail::vector_data<boost::fusion::detail::index_sequence<0ul>,unsigned_short&>::
  vector_data<unsigned_short&>
            ((vector_data<boost::fusion::detail::index_sequence<0ul>,unsigned_short&> *)this,u);
  return;
}

Assistant:

BOOST_FUSION_GPU_ENABLED
        vector(U&&... u)
            : base(vector_detail::dispatch<vector>(std::forward<U>(u)...), std::forward<U>(u)...)
        {}

        template <typename Sequence>
        BOOST_CXX14_CONSTEXPR BOOST_FUSION_GPU_ENABLED
        vector&
        operator=(Sequence&& rhs)
        {
            typedef typename
                vector_detail::make_indices_from_seq<Sequence>::type
            indices;
            base::assign(std::forward<Sequence>(rhs), indices());
            return *this;
        }